

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::NewPlaceholderFileWithMutexHeld(DescriptorPool *this,string *name)

{
  FileDescriptor *__s;
  string *psVar1;
  FileOptions *pFVar2;
  FileDescriptorTables *pFVar3;
  SourceCodeInfo *pSVar4;
  string *in_RDI;
  Tables *unaff_retaddr;
  FileDescriptor *placeholder;
  
  psVar1 = in_RDI;
  if (*(long *)in_RDI != 0) {
    internal::WrappedMutex::AssertHeld(*(WrappedMutex **)in_RDI);
  }
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x49fc19);
  __s = Tables::Allocate<google::protobuf::FileDescriptor>((Tables *)0x49fc21);
  memset(__s,0,0xa0);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x49fc45);
  psVar1 = Tables::AllocateString(unaff_retaddr,psVar1);
  *(string **)__s = psVar1;
  psVar1 = internal::GetEmptyString_abi_cxx11_();
  *(string **)(__s + 8) = psVar1;
  *(string **)(__s + 0x10) = in_RDI;
  pFVar2 = FileOptions::default_instance();
  *(FileOptions **)(__s + 0x88) = pFVar2;
  pFVar3 = FileDescriptorTables::GetEmptyInstance();
  *(FileDescriptorTables **)(__s + 0x90) = pFVar3;
  pSVar4 = SourceCodeInfo::default_instance();
  *(SourceCodeInfo **)(__s + 0x98) = pSVar4;
  __s[0x40] = (FileDescriptor)0x1;
  *(undefined4 *)(__s + 0x3c) = 2;
  __s[0x41] = (FileDescriptor)0x1;
  return __s;
}

Assistant:

FileDescriptor* DescriptorPool::NewPlaceholderFileWithMutexHeld(
    const std::string& name) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  FileDescriptor* placeholder = tables_->Allocate<FileDescriptor>();
  memset(static_cast<void*>(placeholder), 0, sizeof(*placeholder));

  placeholder->name_ = tables_->AllocateString(name);
  placeholder->package_ = &internal::GetEmptyString();
  placeholder->pool_ = this;
  placeholder->options_ = &FileOptions::default_instance();
  placeholder->tables_ = &FileDescriptorTables::GetEmptyInstance();
  placeholder->source_code_info_ = &SourceCodeInfo::default_instance();
  placeholder->is_placeholder_ = true;
  placeholder->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  placeholder->finished_building_ = true;
  // All other fields are zero or nullptr.

  return placeholder;
}